

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O3

StringTree *
capnp::anon_unknown_2::print
          (StringTree *__return_storage_ptr__,Reader *value,Which which,Indent indent,PrintMode mode
          )

{
  ushort uVar1;
  double f;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  StringTree *pSVar2;
  RemoveConst<kj::StringTree> *pRVar3;
  StringTree *pSVar4;
  anon_union_8_2_eba6ea51_for_Type_5 aVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  Branch *pBVar10;
  undefined2 uVar11;
  ArrayDisposer *pAVar12;
  StructSchema SVar13;
  ReaderFor<bool> RVar14;
  bool bVar15;
  kj kVar16;
  Which WVar17;
  undefined4 uVar18;
  uint64_t i;
  int64_t i_00;
  StringTree *pSVar19;
  int iVar20;
  Indent IVar21;
  undefined6 in_register_00000012;
  CappedArray<char,_26UL> *extraout_RDX;
  CappedArray<char,_26UL> *extraout_RDX_00;
  CappedArray<char,_26UL> *params;
  CappedArray<char,_24UL> *params_00;
  CappedArray<char,_32UL> *params_01;
  SegmentReader *pSVar22;
  Branch *pBVar23;
  size_t sVar24;
  undefined4 in_register_00000084;
  char *pcVar25;
  FixedArray<char,_1UL> *pFVar26;
  WirePointer *pWVar27;
  ulong uVar28;
  uint index;
  char *pcVar29;
  float f_00;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 uVar32;
  ReaderFor<DynamicEnum> RVar33;
  Reader RVar34;
  ReaderFor<Text> RVar35;
  Reader RVar36;
  ArrayPtr<const_unsigned_char> bytes;
  ArrayPtr<const_unsigned_char> bytes_00;
  Vector<kj::StringTree> printedFields;
  FieldSubset unionFields;
  Field field;
  StringTree unionValue;
  ArrayBuilder<kj::StringTree> builder;
  Maybe<capnp::StructSchema::Field> which_1;
  FieldSubset nonUnionFields;
  ReaderFor<capnp::DynamicStruct> structValue;
  Vector<kj::StringTree> local_358;
  Schema local_330;
  PrintMode local_328;
  Indent local_324;
  StringTree *local_320;
  ArrayDisposer *local_318;
  ArrayDisposer *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  anon_union_8_2_eba6ea51_for_Type_5 local_2f8;
  undefined8 uStack_2f0;
  undefined8 *local_2e8;
  int local_2e0;
  undefined4 uStack_2dc;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 *local_2c8;
  short local_2bc;
  int local_2b8;
  WirePointer *local_2a8;
  Indent local_29c;
  undefined1 local_298 [8];
  char *pcStack_290;
  StructReader SStack_288;
  Schema local_258;
  char *pcStack_250;
  SegmentReader *local_248;
  ArrayDisposer *pAStack_240;
  Branch *local_238;
  WirePointer *pWStack_230;
  ArrayDisposer *local_228;
  undefined8 local_218;
  anon_union_64_12_1c583c3a_for_Reader_1 aStack_210;
  StringTree local_1c8;
  Maybe<capnp::StructSchema::Field> local_190;
  Array<kj::StringTree> local_148;
  Array<kj::StringTree> local_128;
  ulong local_110;
  undefined1 local_108 [24];
  ArrayDisposer *local_f0;
  Branch *pBStack_e8;
  undefined8 *local_e0;
  ArrayDisposer *local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  ArrayPtr<const_char> local_c0;
  FieldSubset local_b0;
  ReaderFor<DynamicStruct> local_68;
  
  pcVar25 = (char *)CONCAT44(in_register_00000084,mode);
  pcVar29._2_6_ = in_register_00000012;
  pcVar29._0_2_ = which;
  local_328 = mode;
  local_324.amount = indent.amount;
  local_320 = __return_storage_ptr__;
  switch(value->type) {
  case UNKNOWN:
    local_2f8.schema = (RawBrandedSchema *)0x2f8eca;
    uStack_2f0 = (ArrayPtr<const_char> *)0x1;
    goto LAB_0025bf62;
  case VOID:
    local_2f8 = (anon_union_8_2_eba6ea51_for_Type_5)0x2b37b0;
    uStack_2f0 = (ArrayPtr<const_char> *)0x4;
    goto LAB_0025bf62;
  case BOOL:
    RVar14 = DynamicValue::Reader::AsImpl<bool,_(capnp::Kind)0>::apply(value);
    pcVar29 = "false";
    if (RVar14) {
      pcVar29 = "true";
    }
    uStack_2f0 = (ArrayPtr<const_char> *)((ulong)RVar14 ^ 5);
    local_2f8 = (anon_union_8_2_eba6ea51_for_Type_5)pcVar29;
    goto LAB_0025bf62;
  case INT:
    i_00 = DynamicValue::Reader::AsImpl<long,_(capnp::Kind)0>::apply(value);
    kj::_::Stringifier::operator*
              ((CappedArray<char,_26UL> *)&local_2f8,(Stringifier *)&kj::_::STR,i_00);
    params = extraout_RDX_00;
    goto LAB_0025beb7;
  case UINT:
    i = DynamicValue::Reader::AsImpl<unsigned_long,_(capnp::Kind)0>::apply(value);
    kj::_::Stringifier::operator*
              ((CappedArray<char,_26UL> *)&local_2f8,(Stringifier *)&kj::_::STR,i);
    params = extraout_RDX;
LAB_0025beb7:
    pSVar19 = kj::StringTree::concat<kj::CappedArray<char,26ul>>
                        (__return_storage_ptr__,(StringTree *)&local_2f8,params);
    break;
  case FLOAT:
    if (which == FLOAT32) {
      f_00 = DynamicValue::Reader::AsImpl<float,_(capnp::Kind)0>::apply(value);
      kj::_::Stringifier::operator*
                ((CappedArray<char,_24UL> *)&local_2f8,(Stringifier *)&kj::_::STR,f_00);
      pSVar19 = kj::StringTree::concat<kj::CappedArray<char,24ul>>
                          (__return_storage_ptr__,(StringTree *)&local_2f8,params_00);
    }
    else {
      f = DynamicValue::Reader::AsImpl<double,_(capnp::Kind)0>::apply(value);
      kj::_::Stringifier::operator*
                ((CappedArray<char,_32UL> *)&local_2f8,(Stringifier *)&kj::_::STR,f);
      pSVar19 = kj::StringTree::concat<kj::CappedArray<char,32ul>>
                          (__return_storage_ptr__,(StringTree *)&local_2f8,params_01);
    }
    break;
  case TEXT:
    RVar35 = DynamicValue::Reader::AsImpl<capnp::Text,_(capnp::Kind)1>::apply(value);
    bytes_00.ptr = RVar35.super_StringPtr.content.size_ - 1;
    local_b0.parent.super_Schema.raw._0_1_ = 0x22;
    bytes_00.size_ = 0;
    kj::_::encodeCEscapeImpl
              ((String *)&local_2f8,RVar35.super_StringPtr.content.ptr,bytes_00,SUB81(pcVar25,0));
    local_190.ptr.isSet = true;
    pSVar19 = kj::strTree<char,kj::String,char>
                        (__return_storage_ptr__,(kj *)&local_b0,(char *)&local_2f8.scopeId,
                         (String *)&local_190,pcVar25);
    lVar6 = (long)uStack_2f0;
    aVar5 = local_2f8;
    if (local_2f8.schema != (RawBrandedSchema *)0x0) {
      local_2f8.schema = (RawBrandedSchema *)0x0;
      uStack_2f0 = (ArrayPtr<const_char> *)0x0;
      pSVar19 = (StringTree *)(**(code **)*local_2e8)(local_2e8,aVar5.schema,1,lVar6,lVar6,0);
    }
    break;
  case DATA:
    RVar34 = DynamicValue::Reader::AsImpl<capnp::Data,_(capnp::Kind)1>::apply(value);
    bytes.ptr = (uchar *)RVar34.super_ArrayPtr<const_unsigned_char>.size_;
    local_b0.parent.super_Schema.raw._0_1_ = 0x22;
    bytes.size_ = 1;
    kj::_::encodeCEscapeImpl
              ((String *)&local_2f8,(_ *)RVar34.super_ArrayPtr<const_unsigned_char>.ptr,bytes,
               SUB81(pcVar25,0));
    local_190.ptr.isSet = true;
    pSVar19 = kj::strTree<char,kj::String,char>
                        (__return_storage_ptr__,(kj *)&local_b0,(char *)&local_2f8.scopeId,
                         (String *)&local_190,pcVar25);
    lVar6 = (long)uStack_2f0;
    aVar5 = local_2f8;
    if (local_2f8.schema != (RawBrandedSchema *)0x0) {
      local_2f8.schema = (RawBrandedSchema *)0x0;
      uStack_2f0 = (ArrayPtr<const_char> *)0x0;
      pSVar19 = (StringTree *)(**(code **)*local_2e8)(local_2e8,aVar5.schema,1,lVar6,lVar6,0);
    }
    break;
  case LIST:
    DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply
              ((ReaderFor<DynamicList> *)&local_b0,value);
    WVar17 = LIST;
    if (((ulong)local_b0.parent.super_Schema.raw & 0xff0000) == 0) {
      WVar17 = (Which)local_b0.parent.super_Schema.raw;
    }
    uVar28 = (ulong)local_b0.list.reader.structDataSize;
    index = 0;
    pSVar19 = (StringTree *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x38,0,uVar28,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    aStack_210.structValue.reader.segment = (SegmentReader *)(pSVar19 + uVar28);
    aStack_210.listValue.reader.segment = (SegmentReader *)&kj::_::HeapArrayDisposer::instance;
    local_308 = pSVar19;
    local_218 = pSVar19;
    aStack_210.anyPointerValue.reader.segment = (SegmentReader *)pSVar19;
    if (local_b0.list.reader.structDataSize != 0) {
      IVar21.amount = indent.amount + 1;
      if (indent.amount == 0) {
        IVar21.amount = 0;
      }
      do {
        DynamicList::Reader::operator[]((Reader *)&local_2f8,(Reader *)&local_b0,index);
        print((StringTree *)&local_190,(Reader *)&local_2f8,WVar17,IVar21,BARE);
        pSVar19->size_ = local_190.ptr._0_8_;
        (pSVar19->text).content.ptr = (char *)local_190.ptr.field_1.value.parent.super_Schema.raw;
        (pSVar19->text).content.size_ = local_190.ptr.field_1._8_8_;
        local_190.ptr.field_1.value.parent.super_Schema.raw = (StructSchema)(Schema)0x0;
        local_190.ptr.field_1._8_8_ = 0;
        (pSVar19->text).content.disposer =
             (ArrayDisposer *)local_190.ptr.field_1.value.proto._reader.segment;
        (pSVar19->branches).ptr = (Branch *)local_190.ptr.field_1.value.proto._reader.capTable;
        (pSVar19->branches).size_ = (size_t)local_190.ptr.field_1.value.proto._reader.data;
        (pSVar19->branches).disposer =
             (ArrayDisposer *)local_190.ptr.field_1.value.proto._reader.pointers;
        local_190.ptr.field_1.value.proto._reader.capTable = (CapTableReader *)0x0;
        local_190.ptr.field_1.value.proto._reader.data = (void *)0x0;
        pSVar19 = pSVar19 + 1;
        aStack_210.anyPointerValue.reader.segment = (SegmentReader *)pSVar19;
        DynamicValue::Reader::~Reader((Reader *)&local_2f8);
        index = index + 1;
      } while (index != local_b0.list.reader.structDataSize);
    }
    local_128.size_ = ((long)pSVar19 - (long)local_308 >> 3) * 0x6db6db6db6db6db7;
    SStack_288.segment = (SegmentReader *)&kj::_::HeapArrayDisposer::instance;
    local_128.ptr = local_308;
    local_128.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_298 = (undefined1  [8])0x0;
    pcStack_290 = (char *)0x0;
    pFVar26 = (FixedArray<char,_1UL> *)0x0;
    Indent::delimit((StringTree *)&local_2f8,&local_324,&local_128,local_328,LIST);
    local_190.ptr.isSet = true;
    local_218 = (StringTree *)CONCAT71(local_218._1_7_,0x5d);
    pSVar19 = kj::StringTree::
              concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
                        (local_320,(StringTree *)&local_190,(FixedArray<char,_1UL> *)&local_2f8,
                         (StringTree *)&local_218,pFVar26);
    uVar8 = local_2d0;
    lVar6 = uStack_2d8;
    if (uStack_2d8 != 0) {
      uStack_2d8 = 0;
      local_2d0 = 0;
      pSVar19 = (StringTree *)
                (**(code **)*local_2c8)
                          (local_2c8,lVar6,0x40,uVar8,uVar8,
                           kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    puVar7 = local_2e8;
    lVar6 = (long)uStack_2f0;
    if (uStack_2f0 != (ArrayPtr<const_char> *)0x0) {
      uStack_2f0 = (ArrayPtr<const_char> *)0x0;
      local_2e8 = (undefined8 *)0x0;
      pSVar19 = (StringTree *)
                (*(code *)**(undefined8 **)CONCAT44(uStack_2dc,local_2e0))
                          ((undefined8 *)CONCAT44(uStack_2dc,local_2e0),lVar6,1,puVar7,puVar7,0);
    }
    sVar24 = local_128.size_;
    pSVar2 = local_128.ptr;
    if (local_128.ptr != (StringTree *)0x0) {
      local_128.ptr = (StringTree *)0x0;
      local_128.size_ = 0;
      pSVar19 = (StringTree *)
                (*(code *)**(undefined8 **)local_128.disposer)
                          (local_128.disposer,pSVar2,0x38,sVar24,sVar24,
                           kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
    }
    break;
  case ENUM:
    RVar33 = DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply(value);
    local_b0.parent.super_Schema.raw = (Schema)RVar33.schema.super_Schema.raw;
    local_b0.list.reader.segment._0_2_ = RVar33.value;
    DynamicEnum::getEnumerant
              ((Maybe<capnp::EnumSchema::Enumerant> *)&local_2f8,(DynamicEnum *)&local_b0);
    if (local_2f8.scopeId._0_1_ == '\x01') {
      bVar15 = local_2bc == 0;
      local_2e8 = local_2c8;
      if (bVar15) {
        local_2e8 = (undefined8 *)0x0;
      }
      iVar20 = 0x7fffffff;
      if (!bVar15) {
        iVar20 = local_2b8;
      }
      local_2f8.scopeId._0_4_ = 0;
      local_2f8.scopeId._4_4_ = 0;
      uVar31 = 0;
      uVar30 = 0;
      if (!bVar15) {
        local_2f8.scopeId._0_4_ = local_2e0;
        local_2f8.scopeId._4_4_ = uStack_2dc;
        uVar31 = (undefined4)uStack_2d8;
        uVar30 = uStack_2d8._4_4_;
      }
      uStack_2f0 = (ArrayPtr<const_char> *)CONCAT44(uVar30,uVar31);
      local_2e0 = iVar20;
      RVar36 = capnp::_::PointerReader::getBlob<capnp::Text>
                         ((PointerReader *)&local_2f8,(void *)0x0,0);
      local_2f8.scopeId = RVar36.super_StringPtr.content.ptr;
      uStack_2f0 = (ArrayPtr<const_char> *)(RVar36.super_StringPtr.content.size_ - 1);
      pSVar19 = kj::StringTree::concat<kj::ArrayPtr<char_const>>
                          (__return_storage_ptr__,(StringTree *)&local_2f8,uStack_2f0);
    }
    else {
      local_190.ptr.isSet = true;
      local_2f8.scopeId._0_2_ = (uint16_t)local_b0.list.reader.segment;
      local_218 = (StringTree *)CONCAT71(local_218._1_7_,0x29);
      pSVar19 = kj::strTree<char,unsigned_short,char>
                          (__return_storage_ptr__,(kj *)&local_190,(char *)&local_2f8.scopeId,
                           (unsigned_short *)&local_218,pcVar25);
    }
    break;
  case STRUCT:
    DynamicValue::Reader::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply(&local_68,value);
    local_b0.parent.super_Schema.raw = local_68.schema.super_Schema.raw;
    StructSchema::getUnionFields((FieldSubset *)&local_2f8,&local_b0.parent);
    local_190.ptr._0_8_ = local_68.schema.super_Schema.raw;
    StructSchema::getNonUnionFields(&local_b0,(StructSchema *)&local_190);
    uVar28 = (ulong)((local_b0.size_ + 1) - (uint)(local_2b8 == 0));
    local_358.builder.ptr =
         (StringTree *)
         kj::_::HeapArrayDisposer::allocateImpl
                   (0x38,0,uVar28,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_358.builder.endPtr = local_358.builder.ptr + uVar28;
    local_358.builder.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_358.builder.pos = local_358.builder.ptr;
    DynamicStruct::Reader::which(&local_190,&local_68);
    uVar31 = local_190.ptr.field_1.value.proto._reader.nestingLimit;
    uVar11 = local_190.ptr.field_1.value.proto._reader.pointerCount;
    uVar8 = local_190.ptr.field_1.value.proto._reader.pointers;
    local_238 = (Branch *)0x0;
    pWStack_230 = (WirePointer *)0x0;
    local_248 = (SegmentReader *)0x0;
    pAStack_240 = (ArrayDisposer *)0x0;
    local_258.raw = (RawBrandedSchema *)0x0;
    pcStack_250 = (char *)0x0;
    local_228 = (ArrayDisposer *)0x0;
    local_310 = (ArrayDisposer *)0x0;
    pWVar27 = (WirePointer *)0x0;
    pBVar23 = (Branch *)0x0;
    local_318 = (ArrayDisposer *)0x0;
    pSVar22 = (SegmentReader *)0x0;
    pcVar29 = (char *)0x0;
    local_330.raw = (RawBrandedSchema *)0x0;
    if ((kj)local_190.ptr.isSet == (kj)0x1) {
      local_308 = (StringTree *)local_190.ptr.field_1.value.proto._reader.segment;
      uStack_300 = local_190.ptr.field_1.value.proto._reader.capTable;
      if (((local_190.ptr.field_1.value.proto._reader.dataSize < 0x20) ||
          (*(short *)((long)local_190.ptr.field_1.value.proto._reader.data + 2) != -1)) ||
         (field_00.proto._reader.pointerCount =
               local_190.ptr.field_1.value.proto._reader.pointerCount,
         field_00.proto._reader.dataSize = local_190.ptr.field_1.value.proto._reader.dataSize,
         field_00.proto._reader._38_2_ = local_190.ptr.field_1._54_2_,
         field_00.proto._reader._44_4_ = local_190.ptr.field_1._60_4_,
         field_00.proto._reader.nestingLimit =
              local_190.ptr.field_1.value.proto._reader.nestingLimit,
         field_00._8_8_ = local_190.ptr.field_1._8_8_,
         field_00.parent.super_Schema.raw =
              (Schema)(Schema)local_190.ptr.field_1.value.parent.super_Schema.raw,
         field_00.proto._reader.segment = local_190.ptr.field_1.value.proto._reader.segment,
         field_00.proto._reader.capTable = local_190.ptr.field_1.value.proto._reader.capTable,
         field_00.proto._reader.data = local_190.ptr.field_1.value.proto._reader.data,
         field_00.proto._reader.pointers = local_190.ptr.field_1.value.proto._reader.pointers,
         bVar15 = DynamicStruct::Reader::has(&local_68,field_00,NON_NULL), bVar15)) {
        uVar30 = 0;
        uVar32 = 0;
        aStack_210.intValue._0_4_ = 0;
        aStack_210.intValue._4_4_ = 0;
        aStack_210.textValue.super_StringPtr.content.size_ = uVar8;
        if (uVar11 == 0) {
          aStack_210.textValue.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
        }
        uVar18 = 0x7fffffff;
        if (uVar11 != 0) {
          uVar30 = (undefined4)local_308;
          uVar32 = local_308._4_4_;
          aStack_210.intValue._0_4_ = (undefined4)uStack_300;
          aStack_210.intValue._4_4_ = uStack_300._4_4_;
          uVar18 = uVar31;
        }
        local_218 = (StringTree *)CONCAT44(uVar32,uVar30);
        aStack_210._16_4_ = uVar18;
        RVar36 = capnp::_::PointerReader::getBlob<capnp::Text>
                           ((PointerReader *)&local_218,(void *)0x0,0);
        field_01.proto._reader.pointerCount = local_190.ptr.field_1.value.proto._reader.pointerCount
        ;
        field_01.proto._reader.dataSize = local_190.ptr.field_1.value.proto._reader.dataSize;
        field_01.proto._reader._38_2_ = local_190.ptr.field_1._54_2_;
        field_01.proto._reader._44_4_ = local_190.ptr.field_1._60_4_;
        field_01.proto._reader.nestingLimit = local_190.ptr.field_1.value.proto._reader.nestingLimit
        ;
        field_01._8_8_ = local_190.ptr.field_1._8_8_;
        field_01.parent.super_Schema.raw =
             (Schema)(Schema)local_190.ptr.field_1.value.parent.super_Schema.raw;
        field_01.proto._reader.segment = local_190.ptr.field_1.value.proto._reader.segment;
        field_01.proto._reader.capTable = local_190.ptr.field_1.value.proto._reader.capTable;
        field_01.proto._reader.data = local_190.ptr.field_1.value.proto._reader.data;
        field_01.proto._reader.pointers = local_190.ptr.field_1.value.proto._reader.pointers;
        DynamicStruct::Reader::get((Reader *)&local_218,&local_68,field_01);
        WVar17 = whichFieldType(&local_190.ptr.field_1.value);
        IVar21.amount = indent.amount + 1;
        if (indent.amount == 0) {
          IVar21.amount = 0;
        }
        pSVar19 = (StringTree *)0x1;
        print(&local_1c8,(Reader *)&local_218,WVar17,IVar21,PREFIXED);
        local_f0 = (ArrayDisposer *)(RVar36.super_StringPtr.content.size_ - 1);
        local_108._0_8_ = " = ";
        local_108._8_8_ = (char *)0x3;
        local_108._16_8_ = RVar36.super_StringPtr.content.ptr;
        kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
                  ((StringTree *)local_298,(StringTree *)(local_108 + 0x10),
                   (ArrayPtr<const_char> *)local_108,(ArrayPtr<const_char> *)&local_1c8,pSVar19);
        sVar24 = local_1c8.branches.size_;
        pBVar10 = local_1c8.branches.ptr;
        pWVar27 = SStack_288.pointers;
        pBVar23 = (Branch *)SStack_288.data;
        pSVar22 = SStack_288.segment;
        pcVar29 = pcStack_290;
        local_330.raw = (RawBrandedSchema *)local_298;
        local_258.raw = (RawBrandedSchema *)local_298;
        local_318 = (ArrayDisposer *)CONCAT44(SStack_288.capTable._4_4_,SStack_288.capTable._0_4_);
        pcStack_250 = pcStack_290;
        local_248 = SStack_288.segment;
        pcStack_290 = (char *)0x0;
        SStack_288.segment = (SegmentReader *)0x0;
        local_310 = (ArrayDisposer *)
                    CONCAT26(SStack_288._38_2_,CONCAT24(SStack_288.pointerCount,SStack_288.dataSize)
                            );
        local_238 = (Branch *)SStack_288.data;
        pWStack_230 = SStack_288.pointers;
        SStack_288.data = (Branch *)0x0;
        SStack_288.pointers = (WirePointer *)0x0;
        pAStack_240 = local_318;
        local_228 = local_310;
        if (local_1c8.branches.ptr != (Branch *)0x0) {
          local_1c8.branches.ptr = (Branch *)0x0;
          local_1c8.branches.size_ = 0;
          (*(code *)**(undefined8 **)local_1c8.branches.disposer)
                    (local_1c8.branches.disposer,pBVar10,0x40,sVar24,sVar24,
                     kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
        }
        sVar24 = local_1c8.text.content.size_;
        pcVar25 = local_1c8.text.content.ptr;
        if (local_1c8.text.content.ptr != (char *)0x0) {
          local_1c8.text.content.ptr = (char *)0x0;
          local_1c8.text.content.size_ = 0;
          (*(code *)**(undefined8 **)
                      CONCAT44(local_1c8.text.content.disposer._4_4_,
                               local_1c8.text.content.disposer._0_4_))
                    ((undefined8 *)
                     CONCAT44(local_1c8.text.content.disposer._4_4_,
                              local_1c8.text.content.disposer._0_4_),pcVar25,1,sVar24,sVar24,0);
        }
        DynamicValue::Reader::~Reader((Reader *)&local_218);
      }
      else {
        local_310 = (ArrayDisposer *)0x0;
        pWVar27 = (WirePointer *)0x0;
        pBVar23 = (Branch *)0x0;
        local_318 = (ArrayDisposer *)0x0;
        pSVar22 = (SegmentReader *)0x0;
        pcVar29 = (char *)0x0;
        local_330.raw = (RawBrandedSchema *)0x0;
        if ((kj)local_190.ptr.isSet == (kj)0x1) {
          local_190.ptr._0_8_ = local_190.ptr._0_8_ & 0xffffffffffffff00;
          local_310 = (ArrayDisposer *)0x0;
          pWVar27 = (WirePointer *)0x0;
          pBVar23 = (Branch *)0x0;
          local_318 = (ArrayDisposer *)0x0;
          pSVar22 = (SegmentReader *)0x0;
          pcVar29 = (char *)0x0;
          local_330.raw = (RawBrandedSchema *)0x0;
        }
      }
    }
    local_110 = (ulong)local_b0.size_;
    local_308 = (StringTree *)pcVar29;
    local_2a8 = pWVar27;
    if (local_110 != 0) {
      local_29c.amount = indent.amount + 1;
      if (indent.amount == 0) {
        local_29c.amount = 0;
      }
      uVar28 = 0;
      do {
        SVar13.super_Schema.raw = local_b0.parent.super_Schema.raw;
        uVar1 = local_b0.indices[uVar28];
        capnp::_::ListReader::getStructElement(&SStack_288,&local_b0.list.reader,(uint)uVar1);
        pWVar27 = local_2a8;
        pcVar29 = (char *)local_308;
        local_298 = (undefined1  [8])SVar13.super_Schema.raw;
        pcStack_290 = (char *)CONCAT44(pcStack_290._4_4_,(uint)uVar1);
        if (((kj)local_190.ptr.isSet == (kj)0x1) && (local_190.ptr.field_1.value.index < uVar1)) {
          kVar16 = (kj)0x1;
          if (local_358.builder.pos == local_358.builder.endPtr) {
            sVar24 = ((long)local_358.builder.pos - (long)local_358.builder.ptr >> 3) *
                     -0x2492492492492492;
            if (local_358.builder.pos == local_358.builder.ptr) {
              sVar24 = 4;
            }
            kj::Vector<kj::StringTree>::setCapacity(&local_358,sVar24);
            kVar16 = (kj)local_190.ptr.isSet;
          }
          (local_358.builder.pos)->size_ = (size_t)local_330.raw;
          ((local_358.builder.pos)->text).content.ptr = pcVar29;
          ((local_358.builder.pos)->text).content.size_ = (size_t)pSVar22;
          ((local_358.builder.pos)->text).content.disposer = local_318;
          pcStack_250 = (char *)0x0;
          local_248 = (SegmentReader *)0x0;
          ((local_358.builder.pos)->branches).ptr = pBVar23;
          ((local_358.builder.pos)->branches).size_ = (size_t)pWVar27;
          ((local_358.builder.pos)->branches).disposer = local_310;
          local_238 = (Branch *)0x0;
          pWStack_230 = (WirePointer *)0x0;
          local_358.builder.pos = local_358.builder.pos + 1;
          local_2a8 = (WirePointer *)0x0;
          pBVar23 = (Branch *)0x0;
          pSVar22 = (SegmentReader *)0x0;
          local_308 = (StringTree *)0x0;
          if (((byte)kVar16 & 1) != 0) {
            local_190.ptr._0_8_ = local_190.ptr._0_8_ & 0xffffffffffffff00;
            local_2a8 = (WirePointer *)0x0;
            pBVar23 = (Branch *)0x0;
            pSVar22 = (SegmentReader *)0x0;
            local_308 = (StringTree *)0x0;
          }
        }
        field_02.proto._reader.capTable._4_4_ = SStack_288.capTable._4_4_;
        field_02.proto._reader.capTable._0_4_ = SStack_288.capTable._0_4_;
        field_02.proto._reader.pointerCount = SStack_288.pointerCount;
        field_02.proto._reader.dataSize = SStack_288.dataSize;
        field_02.proto._reader._38_2_ = SStack_288._38_2_;
        field_02.proto._reader._44_4_ = SStack_288._44_4_;
        field_02.proto._reader.nestingLimit = SStack_288.nestingLimit;
        field_02._8_8_ = pcStack_290;
        field_02.parent.super_Schema.raw = (Schema)(Schema)local_298;
        field_02.proto._reader.segment = SStack_288.segment;
        field_02.proto._reader.data = SStack_288.data;
        field_02.proto._reader.pointers = SStack_288.pointers;
        bVar15 = DynamicStruct::Reader::has(&local_68,field_02,NON_NULL);
        if (bVar15) {
          iVar20 = SStack_288.nestingLimit;
          aStack_210.textValue.super_StringPtr.content.size_ = (size_t)SStack_288.pointers;
          if (SStack_288.pointerCount == 0) {
            aStack_210.textValue.super_StringPtr.content.size_ = (size_t)(WirePointer *)0x0;
            iVar20 = 0x7fffffff;
          }
          uVar31 = 0;
          uVar30 = 0;
          aStack_210.intValue._0_4_ = 0;
          aStack_210.intValue._4_4_ = 0;
          if (SStack_288.pointerCount != 0) {
            uVar31 = SStack_288.segment._0_4_;
            uVar30 = SStack_288.segment._4_4_;
            aStack_210.intValue._0_4_ = SStack_288.capTable._0_4_;
            aStack_210.intValue._4_4_ = SStack_288.capTable._4_4_;
          }
          local_218 = (StringTree *)CONCAT44(uVar30,uVar31);
          aStack_210._16_4_ = iVar20;
          RVar36 = capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&local_218,(void *)0x0,0);
          field_03.proto._reader.capTable._4_4_ = SStack_288.capTable._4_4_;
          field_03.proto._reader.capTable._0_4_ = SStack_288.capTable._0_4_;
          field_03.proto._reader.pointerCount = SStack_288.pointerCount;
          field_03.proto._reader.dataSize = SStack_288.dataSize;
          field_03.proto._reader._38_2_ = SStack_288._38_2_;
          field_03.proto._reader._44_4_ = SStack_288._44_4_;
          field_03.proto._reader.nestingLimit = SStack_288.nestingLimit;
          field_03._8_8_ = pcStack_290;
          field_03.parent.super_Schema.raw = (Schema)(Schema)local_298;
          field_03.proto._reader.segment = SStack_288.segment;
          field_03.proto._reader.data = SStack_288.data;
          field_03.proto._reader.pointers = SStack_288.pointers;
          DynamicStruct::Reader::get((Reader *)&local_218,&local_68,field_03);
          WVar17 = whichFieldType((Field *)local_298);
          pSVar19 = (StringTree *)0x1;
          print((StringTree *)(local_108 + 0x10),(Reader *)&local_218,WVar17,local_29c,PREFIXED);
          local_108._8_8_ = RVar36.super_StringPtr.content.size_ - 1;
          local_c0.ptr = " = ";
          local_c0.size_ = 3;
          local_108._0_8_ = RVar36.super_StringPtr.content.ptr;
          kj::StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree>
                    (&local_1c8,(StringTree *)local_108,&local_c0,
                     (ArrayPtr<const_char> *)(local_108 + 0x10),pSVar19);
          if (local_358.builder.pos == local_358.builder.endPtr) {
            sVar24 = ((long)local_358.builder.pos - (long)local_358.builder.ptr >> 3) *
                     -0x2492492492492492;
            if (local_358.builder.pos == local_358.builder.ptr) {
              sVar24 = 4;
            }
            kj::Vector<kj::StringTree>::setCapacity(&local_358,sVar24);
          }
          uVar8 = uStack_d0;
          pAVar12 = local_d8;
          (local_358.builder.pos)->size_ =
               CONCAT71(local_1c8.size_._1_7_,(undefined1)local_1c8.size_);
          ((local_358.builder.pos)->text).content.ptr = local_1c8.text.content.ptr;
          ((local_358.builder.pos)->text).content.size_ = local_1c8.text.content.size_;
          local_1c8.text.content.ptr = (char *)0x0;
          local_1c8.text.content.size_ = 0;
          *(undefined4 *)&((local_358.builder.pos)->text).content.disposer =
               local_1c8.text.content.disposer._0_4_;
          *(undefined4 *)((long)&((local_358.builder.pos)->text).content.disposer + 4) =
               local_1c8.text.content.disposer._4_4_;
          *(undefined4 *)&((local_358.builder.pos)->branches).ptr = local_1c8.branches.ptr._0_4_;
          *(undefined4 *)((long)&((local_358.builder.pos)->branches).ptr + 4) =
               local_1c8.branches.ptr._4_4_;
          ((local_358.builder.pos)->branches).size_ = local_1c8.branches.size_;
          ((local_358.builder.pos)->branches).disposer = local_1c8.branches.disposer;
          local_1c8.branches.ptr = (Branch *)0x0;
          local_1c8.branches.size_ = 0;
          local_358.builder.pos = local_358.builder.pos + 1;
          if (local_d8 != (ArrayDisposer *)0x0) {
            local_d8 = (ArrayDisposer *)0x0;
            uStack_d0 = 0;
            (**(code **)*local_c8)
                      (local_c8,pAVar12,0x40,uVar8,uVar8,
                       kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
          }
          pBVar10 = pBStack_e8;
          pAVar12 = local_f0;
          if (local_f0 != (ArrayDisposer *)0x0) {
            local_f0 = (ArrayDisposer *)0x0;
            pBStack_e8 = (Branch *)0x0;
            (**(code **)*local_e0)(local_e0,pAVar12,1,pBVar10,pBVar10,0);
          }
          DynamicValue::Reader::~Reader((Reader *)&local_218);
        }
        uVar28 = uVar28 + 1;
      } while (local_110 != uVar28);
    }
    pSVar19 = local_320;
    if ((kj)local_190.ptr.isSet == (kj)0x1) {
      if (local_358.builder.pos == local_358.builder.endPtr) {
        sVar24 = 4;
        if (local_358.builder.pos != local_358.builder.ptr) {
          sVar24 = ((long)local_358.builder.pos - (long)local_358.builder.ptr >> 3) *
                   -0x2492492492492492;
        }
        kj::Vector<kj::StringTree>::setCapacity(&local_358,sVar24);
      }
      (local_358.builder.pos)->size_ = (size_t)local_330.raw;
      ((local_358.builder.pos)->text).content.ptr = pcStack_250;
      ((local_358.builder.pos)->text).content.size_ = (size_t)local_248;
      pcStack_250 = (char *)0x0;
      local_248 = (SegmentReader *)0x0;
      ((local_358.builder.pos)->text).content.disposer = pAStack_240;
      ((local_358.builder.pos)->branches).ptr = local_238;
      ((local_358.builder.pos)->branches).size_ = (size_t)pWStack_230;
      ((local_358.builder.pos)->branches).disposer = local_228;
      local_238 = (Branch *)0x0;
      pWStack_230 = (WirePointer *)0x0;
      local_358.builder.pos = local_358.builder.pos + 1;
    }
    if (local_358.builder.pos != local_358.builder.endPtr) {
      kj::Vector<kj::StringTree>::setCapacity
                (&local_358,
                 ((long)local_358.builder.pos - (long)local_358.builder.ptr >> 3) *
                 0x6db6db6db6db6db7);
    }
    local_148.size_ =
         ((long)local_358.builder.pos - (long)local_358.builder.ptr >> 3) * 0x6db6db6db6db6db7;
    local_148.ptr = local_358.builder.ptr;
    local_148.disposer = local_358.builder.disposer;
    local_358.builder.ptr = (StringTree *)0x0;
    local_358.builder.pos = (RemoveConst<kj::StringTree> *)0x0;
    local_358.builder.endPtr = (StringTree *)0x0;
    pFVar26 = (FixedArray<char,_1UL> *)0x1;
    Indent::delimit((StringTree *)&local_218,&local_324,&local_148,local_328,RECORD);
    local_298[0] = 0x28;
    local_1c8.size_._0_1_ = 0x29;
    pSVar19 = kj::StringTree::
              concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
                        (pSVar19,(StringTree *)local_298,(FixedArray<char,_1UL> *)&local_218,
                         &local_1c8,pFVar26);
    uVar9 = aStack_210.listValue.reader.ptr;
    uVar8 = aStack_210.listValue.reader.capTable;
    if (aStack_210.listValue.reader.capTable != (CapTableReader *)0x0) {
      aStack_210.listValue.reader.capTable = (CapTableReader *)0x0;
      aStack_210.listValue.reader.ptr = (byte *)0x0;
      pSVar19 = (StringTree *)
                (*(code *)**(undefined8 **)aStack_210._40_8_)
                          (aStack_210._40_8_,uVar8,0x40,uVar9,uVar9,
                           kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    uVar9 = aStack_210.textValue.super_StringPtr.content.size_;
    uVar8 = aStack_210.intValue;
    if (aStack_210._0_8_ != (CapTableReader *)0x0) {
      aStack_210.intValue = 0;
      aStack_210.textValue.super_StringPtr.content.size_ = 0;
      pSVar19 = (StringTree *)
                (*(code *)(aStack_210.listValue.reader.segment)->arena->_vptr_Arena)
                          (aStack_210.listValue.reader.segment,uVar8,1,uVar9,uVar9,0);
    }
    sVar24 = local_148.size_;
    pSVar2 = local_148.ptr;
    if (local_148.ptr != (StringTree *)0x0) {
      local_148.ptr = (StringTree *)0x0;
      local_148.size_ = 0;
      pSVar19 = (StringTree *)
                (*(code *)**(undefined8 **)local_148.disposer)
                          (local_148.disposer,pSVar2,0x38,sVar24,sVar24,
                           kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
    }
    pWVar27 = pWStack_230;
    pBVar23 = local_238;
    if (local_238 != (Branch *)0x0) {
      local_238 = (Branch *)0x0;
      pWStack_230 = (WirePointer *)0x0;
      pSVar19 = (StringTree *)
                (*(code *)**(undefined8 **)local_228)
                          (local_228,pBVar23,0x40,pWVar27,pWVar27,
                           kj::ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
    }
    pSVar22 = local_248;
    pcVar29 = pcStack_250;
    if (pcStack_250 != (char *)0x0) {
      pcStack_250 = (char *)0x0;
      local_248 = (SegmentReader *)0x0;
      pSVar19 = (StringTree *)
                (*(code *)**(undefined8 **)pAStack_240)(pAStack_240,pcVar29,1,pSVar22,pSVar22,0);
    }
    pSVar4 = local_358.builder.endPtr;
    pRVar3 = local_358.builder.pos;
    pSVar2 = local_358.builder.ptr;
    if (local_358.builder.ptr != (StringTree *)0x0) {
      local_358.builder.ptr = (StringTree *)0x0;
      local_358.builder.pos = (RemoveConst<kj::StringTree> *)0x0;
      local_358.builder.endPtr = (StringTree *)0x0;
      pSVar19 = (StringTree *)
                (*(code *)**(undefined8 **)local_358.builder.disposer)
                          (local_358.builder.disposer,pSVar2,0x38,
                           ((long)pRVar3 - (long)pSVar2 >> 3) * 0x6db6db6db6db6db7,
                           ((long)pSVar4 - (long)pSVar2 >> 3) * 0x6db6db6db6db6db7,
                           kj::ArrayDisposer::Dispose_<kj::StringTree>::destruct);
    }
    break;
  case CAPABILITY:
    local_2f8 = (anon_union_8_2_eba6ea51_for_Type_5)0x2f788e;
    uStack_2f0 = (ArrayPtr<const_char> *)0x15;
    goto LAB_0025bf62;
  case ANY_POINTER:
    local_2f8 = (anon_union_8_2_eba6ea51_for_Type_5)0x2f78a4;
    uStack_2f0 = (ArrayPtr<const_char> *)0x10;
LAB_0025bf62:
    pSVar19 = kj::StringTree::concat<kj::ArrayPtr<char_const>>
                        (__return_storage_ptr__,(StringTree *)&local_2f8,
                         (ArrayPtr<const_char> *)pcVar29);
    break;
  default:
    kj::_::unreachable();
  }
  return pSVar19;
}

Assistant:

static kj::StringTree print(const DynamicValue::Reader& value,
                            schema::Type::Which which, Indent indent,
                            PrintMode mode) {
  switch (value.getType()) {
    case DynamicValue::UNKNOWN:
      return kj::strTree("?");
    case DynamicValue::VOID:
      return kj::strTree("void");
    case DynamicValue::BOOL:
      return kj::strTree(value.as<bool>() ? "true" : "false");
    case DynamicValue::INT:
      return kj::strTree(value.as<int64_t>());
    case DynamicValue::UINT:
      return kj::strTree(value.as<uint64_t>());
    case DynamicValue::FLOAT:
      if (which == schema::Type::FLOAT32) {
        return kj::strTree(value.as<float>());
      } else {
        return kj::strTree(value.as<double>());
      }
    case DynamicValue::TEXT: {
      kj::ArrayPtr<const char> chars = value.as<Text>();
      return kj::strTree('"', kj::encodeCEscape(chars), '"');
    }
    case DynamicValue::DATA: {
      // TODO(someday): Maybe data should be printed as binary literal.
      kj::ArrayPtr<const byte> bytes = value.as<Data>().asBytes();
      return kj::strTree('"', kj::encodeCEscape(bytes), '"');
    }
    case DynamicValue::LIST: {
      auto listValue = value.as<DynamicList>();
      auto which = listValue.getSchema().whichElementType();
      kj::Array<kj::StringTree> elements = KJ_MAP(element, listValue) {
        return print(element, which, indent.next(), BARE);
      };
      return kj::strTree('[', indent.delimit(kj::mv(elements), mode, PrintKind::LIST), ']');
    }
    case DynamicValue::ENUM: {
      auto enumValue = value.as<DynamicEnum>();
      KJ_IF_SOME(enumerant, enumValue.getEnumerant()) {
        return kj::strTree(enumerant.getProto().getName());
      } else {
        // Unknown enum value; output raw number.
        return kj::strTree('(', enumValue.getRaw(), ')');
      }
      break;
    }
    case DynamicValue::STRUCT: {
      auto structValue = value.as<DynamicStruct>();
      auto unionFields = structValue.getSchema().getUnionFields();
      auto nonUnionFields = structValue.getSchema().getNonUnionFields();

      kj::Vector<kj::StringTree> printedFields(nonUnionFields.size() + (unionFields.size() != 0));

      // We try to write the union field, if any, in proper order with the rest.
      auto which = structValue.which();

      kj::StringTree unionValue;
      KJ_IF_SOME(field, which) {
        // Even if the union field has its default value, if it is not the default field of the
        // union then we have to print it anyway.
        auto fieldProto = field.getProto();
        if (fieldProto.getDiscriminantValue() != 0 || structValue.has(field)) {
          unionValue = kj::strTree(
              fieldProto.getName(), " = ",
              print(structValue.get(field), whichFieldType(field), indent.next(), PREFIXED));
        } else {
          which = kj::none;
        }
      }

      for (auto field: nonUnionFields) {
        KJ_IF_SOME(unionField, which) {
          if (unionField.getIndex() < field.getIndex()) {
            printedFields.add(kj::mv(unionValue));
            which = kj::none;
          }
        }
        if (structValue.has(field)) {
          printedFields.add(kj::strTree(
              field.getProto().getName(), " = ",
              print(structValue.get(field), whichFieldType(field), indent.next(), PREFIXED)));
        }
      }
      if (which != kj::none) {
        // Union value is last.
        printedFields.add(kj::mv(unionValue));
      }

      if (mode == PARENTHESIZED) {
        return indent.delimit(printedFields.releaseAsArray(), mode, PrintKind::RECORD);
      } else {
        return kj::strTree(
            '(', indent.delimit(printedFields.releaseAsArray(), mode, PrintKind::RECORD), ')');
      }
    }
    case DynamicValue::CAPABILITY:
      return kj::strTree("<external capability>");
    case DynamicValue::ANY_POINTER:
      return kj::strTree("<opaque pointer>");
  }